

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_info(char *filename,int *x,int *y,int *comp)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    stbi__g_failure_reason = "can\'t fopen";
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_info_from_file((FILE *)__stream,x,y,comp);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIDEF int stbi_info(char const *filename, int *x, int *y, int *comp)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_info_from_file(f, x, y, comp);
    fclose(f);
    return result;
}